

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::PositionError::operator==(PositionError *this,PositionError *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__b_> local_48;
  KFIXED<short,_(unsigned_char)__b_> local_38;
  
  local_38.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215d48;
  local_38.m_Val = (Value->m_HorzErr).m_Val;
  KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_HorzErr,&local_38);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  if (KVar1) {
    KVar1 = false;
  }
  else {
    local_48.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215d48;
    local_48.m_Val = (Value->m_VertErr).m_Val;
    KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_VertErr,&local_48);
    DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
    KVar1 = !KVar1;
  }
  return KVar1;
}

Assistant:

KBOOL PositionError::operator == ( const PositionError & Value ) const
{
    if( m_HorzErr != Value.m_HorzErr )return false;
    if( m_VertErr != Value.m_VertErr )return false;
    return true;
}